

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bson.hpp
# Opt level: O0

type jsoncons::bson::
     decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (istream *is,bson_decode_options *options)

{
  error_code ec;
  bool bVar1;
  undefined8 uVar2;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDX;
  void *__buf;
  undefined8 extraout_RDX;
  int __fd;
  basic_istream<char,_std::char_traits<char>_> *in_RSI;
  ser_error *in_RDI;
  type tVar3;
  bson_stream_reader reader;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffc98;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffca0;
  bson_decode_options *in_stack_fffffffffffffca8;
  error_code *in_stack_fffffffffffffcb0;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *column;
  undefined1 *line;
  ser_error *psVar4;
  error_category *peVar5;
  temp_allocator_type *in_stack_fffffffffffffcf0;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffcf8;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffd00;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> local_2f8;
  allocator<char> local_9a;
  error_category local_99;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_98;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *local_18;
  basic_istream<char,_std::char_traits<char>_> *local_10;
  
  peVar5 = &local_99;
  psVar4 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(in_stack_fffffffffffffd00,(allocator_type *)in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf0);
  std::allocator<char>::~allocator(&local_9a);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>>
            (in_stack_fffffffffffffc98);
  line = &stack0xfffffffffffffd07;
  this = local_18;
  std::allocator<char>::allocator();
  __fd = (int)local_10;
  column = this;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_reader<std::istream&>
            (this,local_10,(json_visitor *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (allocator<char> *)in_stack_fffffffffffffca0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd07);
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read
            (&local_2f8,__fd,__buf,(size_t)this);
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(&local_98);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>
              (in_stack_fffffffffffffcb0,(conv_errc)((ulong)uVar2 >> 0x20));
    basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::line
              ((basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
               0x235cb9);
    basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::column
              ((basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
               0x235cca);
    ec._M_cat = peVar5;
    ec._0_8_ = psVar4;
    ser_error::ser_error(in_RDI,ec,(size_t)line,(size_t)column);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_fffffffffffffcf8);
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
  ~basic_bson_reader((basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                      *)0x235dd0);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
              *)0x235ddd);
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder(in_stack_fffffffffffffca0);
  tVar3.field_0.int64_.val_ = extraout_RDX;
  tVar3.field_0._0_8_ = psVar4;
  return (type)tVar3.field_0;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_bson(std::istream& is, 
                const bson_decode_options& options = bson_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        bson_stream_reader reader(is, adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }